

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O0

void __thiscall
MaterialSystemTest_testFloatArrayProperty_Test::TestBody
          (MaterialSystemTest_testFloatArrayProperty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  uint *pMax_00;
  bool local_129;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  Message local_88;
  unsigned_long local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60 [3];
  aiReturn local_48 [2];
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  float fStack_28;
  uint pMax;
  float pf [4];
  MaterialSystemTest_testFloatArrayProperty_Test *this_local;
  
  _fStack_28 = 0x3f80000000000000;
  pf[0] = 2.0;
  pf[1] = 3.0;
  gtest_ar.message_.ptr_._4_4_ = 4;
  aiMaterial::AddProperty((this->super_MaterialSystemTest).pcMat,&fStack_28,4,"testKey2",0,0);
  pf[0] = 12.0;
  pf[1] = 12.0;
  _fStack_28 = 0x4140000041400000;
  local_48[1] = 0;
  pMax_00 = (uint *)((long)&gtest_ar.message_.ptr_ + 4);
  local_48[0] = aiMaterial::Get((this->super_MaterialSystemTest).pcMat,"testKey2",0,0,&fStack_28,
                                pMax_00);
  testing::internal::EqHelper<false>::Compare<aiReturn,aiReturn>
            ((EqHelper<false> *)local_40,"aiReturn_SUCCESS","pcMat->Get(\"testKey2\",0,0,pf,&pMax)",
             local_48 + 1,local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_80 = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
            ((EqHelper<false> *)local_78,"sizeof(pf) / sizeof(float)","pMax",&local_80,
             (uint *)((long)&gtest_ar.message_.ptr_ + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_129 = false;
  if ((fStack_28 == 0.0) && (!NAN(fStack_28))) {
    local_129 = false;
    if (((float)pMax == 1.0) && (!NAN((float)pMax))) {
      local_129 = false;
      if ((pf[0] == 2.0) && (!NAN(pf[0]))) {
        local_129 = pf[1] == 3.0;
      }
    }
  }
  local_a1 = local_129;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_a0,
               (AssertionResult *)"!pf[0] && 1.0f == pf[1] && 2.0f == pf[2] && 3.0f == pf[3]",
               "false","true",(char *)pMax_00);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testFloatArrayProperty)
{
    float pf[] = {0.0f,1.0f,2.0f,3.0f};
    unsigned int pMax = sizeof(pf) / sizeof(float);
    this->pcMat->AddProperty(pf,pMax,"testKey2");
    pf[0] = pf[1] = pf[2] = pf[3] = 12.0f;

    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey2",0,0,pf,&pMax));
    EXPECT_EQ(sizeof(pf) / sizeof(float), pMax);
    EXPECT_TRUE(!pf[0] && 1.0f == pf[1] && 2.0f == pf[2] && 3.0f == pf[3] );
}